

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O0

void __thiscall
uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::HttpRouter
          (HttpRouter<uWS::HttpContextData<true>::RouterData> *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  mapped_type *pmVar3;
  long in_RDI;
  string *method;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd40;
  RouteParameters *in_stack_fffffffffffffd50;
  allocator_type *in_stack_fffffffffffffd68;
  allocator<char> *in_stack_fffffffffffffd70;
  iterator in_stack_fffffffffffffd78;
  key_type *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string_view<char,_std::char_traits<char>_> *local_250;
  string *local_238;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178 [2];
  int local_164;
  allocator<char> local_15f [2];
  undefined1 local_15d;
  allocator<char> local_15c;
  allocator<char> local_15b;
  allocator<char> local_15a;
  allocator<char> local_159;
  allocator<char> local_158;
  allocator<char> local_157;
  allocator<char> local_156;
  allocator<char> local_155 [20];
  allocator<char> local_141;
  string *local_140;
  string local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  undefined1 local_38 [32];
  string *local_18;
  undefined8 local_10;
  
  local_15d = 1;
  local_140 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_140 = (string *)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_140 = (string *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_140 = (string *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_140 = (string *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_140 = (string *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_140 = (string *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_140 = (string *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_140 = (string *)local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_15d = 0;
  local_18 = local_138;
  local_10 = 9;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x26ab4b);
  __l._M_len = (size_type)in_stack_fffffffffffffd80;
  __l._M_array = in_stack_fffffffffffffd78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffd70,__l,in_stack_fffffffffffffd68);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x26ab7f);
  local_238 = (string *)&local_18;
  do {
    local_238 = local_238 + -0x20;
    std::__cxx11::string::~string(local_238);
  } while (local_238 != local_138);
  std::allocator<char>::~allocator(&local_15c);
  std::allocator<char>::~allocator(&local_15b);
  std::allocator<char>::~allocator(&local_15a);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::~allocator(&local_158);
  std::allocator<char>::~allocator(&local_157);
  std::allocator<char>::~allocator(&local_156);
  std::allocator<char>::~allocator(local_155);
  std::allocator<char>::~allocator(&local_141);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x26ac5e);
  std::
  vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
  ::vector((vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
            *)0x26ac74);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x70));
  local_250 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x80);
  do {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_250);
    local_250 = local_250 + 1;
  } while (local_250 != (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x6c0));
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  memset(this_00 + 1,0,0x18);
  std::
  vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>_>_>
  ::vector((vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>_>_>
            *)0x26ad2f);
  __k = (key_type *)((long)&this_00[1].field_2 + 8);
  memset(__k,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x26ad53);
  this_00[2].field_2._M_local_buf[0] = '\0';
  std::allocator<char>::~allocator(local_15f);
  RouteParameters::RouteParameters(in_stack_fffffffffffffd50);
  local_164 = 0;
  local_178[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffd38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_stack_fffffffffffffd38);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffd40,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd38);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(local_178);
    iVar1 = local_164;
    local_164 = local_164 + 1;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)this_00,__k);
    *pmVar3 = iVar1;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_178);
  }
  return;
}

Assistant:

HttpRouter() {
        int p = 0;
        for (std::string &method : methods) {
            priority[method] = p++;
        }
    }